

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O0

int tlv_parse_data(uint8_t *buf,size_t buflen,int argc,...)

{
  char in_AL;
  uint32_t block_size;
  uint64_t uVar1;
  uint8_t *puVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  bool local_2c9;
  int *local_2c8;
  undefined8 *local_2b0;
  undefined8 *local_298;
  long *local_280;
  long *local_268;
  undefined8 *local_250;
  undefined8 *local_238;
  undefined8 *local_220;
  undefined8 *local_208;
  undefined8 *local_1f0;
  undefined8 *local_1d8;
  long *local_1c0;
  undefined8 *local_1a8;
  undefined8 *local_190;
  uint32_t *local_170;
  undefined1 local_158 [24];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  byte local_a1;
  ndn_hmac_key_t *pnStack_a0;
  _Bool verify_sig;
  void *key_ptr;
  void *arg_ptr;
  uint8_t **content_ptr;
  uint8_t **finalblockid_ptr;
  uint8_t **namebuf_ptr;
  uint8_t *end;
  uint8_t *valptr;
  uint8_t *ptr;
  uint32_t local_58;
  uint32_t block_len;
  uint32_t block_type;
  TLV_DATAARG_TYPE argtype;
  int ret;
  int i;
  va_list vl;
  int argc_local;
  size_t buflen_local;
  uint8_t *buf_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  block_type = 0;
  namebuf_ptr = (uint8_t **)(buf + buflen);
  finalblockid_ptr = (uint8_t **)0x0;
  content_ptr = (uint8_t **)0x0;
  arg_ptr = (void *)0x0;
  key_ptr = (void *)0x0;
  pnStack_a0 = (ndn_hmac_key_t *)0x0;
  local_a1 = 0;
  local_140 = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  valptr = tlv_get_type_length(buf,buflen,&local_58,(uint32_t *)((long)&ptr + 4));
  if (valptr == (uint8_t *)0x0) {
    buf_local._4_4_ = 0xfffffff2;
  }
  else if (local_58 == 6) {
    if ((uint8_t **)(valptr + ptr._4_4_) == namebuf_ptr) {
      block_size = (uint32_t)buflen;
      block_type = ndn_data_tlv_decode_no_verify
                             (&tlv_parse_data::data,buf,block_size,(uint32_t *)0x0,(uint32_t *)0x0);
      buf_local._4_4_ = block_type;
      if (block_type == 0) {
        vl[0].overflow_arg_area = local_158;
        vl[0]._0_8_ = &stack0x00000008;
        i = 0x30;
        ret = 0x18;
        for (argtype = TLV_DATAARG_NAME_PTR; (int)argtype < argc && block_type == 0;
            argtype = argtype + TLV_DATAARG_NAME_BUF) {
          if ((uint)ret < 0x29) {
            local_170 = (uint32_t *)((long)ret + (long)vl[0].overflow_arg_area);
            ret = ret + 8;
          }
          else {
            local_170 = (uint32_t *)vl[0]._0_8_;
            vl[0]._0_8_ = vl[0]._0_8_ + 8;
          }
          block_len = *local_170;
          switch(block_len) {
          case 0:
            if ((uint)ret < 0x29) {
              local_190 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_190 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_190;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              memcpy(key_ptr,&tlv_parse_data::data,0x1bc);
            }
            break;
          case 1:
            if ((uint)ret < 0x29) {
              local_1a8 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1a8 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            finalblockid_ptr = (uint8_t **)*local_1a8;
            if (finalblockid_ptr == (uint8_t **)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *finalblockid_ptr = (uint8_t *)0x0;
            }
            break;
          case 2:
            if ((uint)ret < 0x29) {
              local_1c0 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1c0 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_1c0;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_data::data.name.components_size == '\0') {
              block_type = 0xffffffef;
            }
            else {
              uVar1 = tlv_decode_segno(tlv_parse_data::data.name.components +
                                       (int)(tlv_parse_data::data.name.components_size - 1));
              *(uint64_t *)key_ptr = uVar1;
            }
            break;
          case 3:
            if ((uint)ret < 0x29) {
              local_1d8 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1d8 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_1d8;
            if ((uint8_t *)key_ptr == (uint8_t *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_data::data.metainfo.enable_ContentType == '\0') {
              *(uint8_t *)key_ptr = 0xff;
            }
            else {
              *(uint8_t *)key_ptr = tlv_parse_data::data.metainfo.content_type;
            }
            break;
          case 4:
            if ((uint)ret < 0x29) {
              local_1f0 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1f0 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_1f0;
            if ((uint64_t *)key_ptr == (uint64_t *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_data::data.metainfo.enable_FreshnessPeriod == '\0') {
              *(uint64_t *)key_ptr = 0;
            }
            else {
              *(uint64_t *)key_ptr = tlv_parse_data::data.metainfo.freshness_period;
            }
            break;
          case 5:
            if ((uint)ret < 0x29) {
              local_208 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_208 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_208;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_data::data.metainfo.enable_FinalBlockId == '\0') {
              *(undefined1 *)((long)key_ptr + 0x28) = 0;
            }
            else {
              memcpy(key_ptr,&tlv_parse_data::data.metainfo.final_block_id,0x2c);
            }
            break;
          case 6:
            if ((uint)ret < 0x29) {
              local_220 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_220 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            content_ptr = (uint8_t **)*local_220;
            if (content_ptr == (uint8_t **)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *content_ptr = (uint8_t *)0x0;
            }
            break;
          case 7:
            if ((uint)ret < 0x29) {
              local_238 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_238 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_238;
            if ((undefined8 *)key_ptr == (undefined8 *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_data::data.metainfo.enable_FinalBlockId == '\0') {
              *(undefined8 *)key_ptr = 0xffffffffffffffff;
            }
            else {
              uVar1 = tlv_decode_segno(&tlv_parse_data::data.metainfo.final_block_id);
              *(uint64_t *)key_ptr = uVar1;
            }
            break;
          case 8:
            if ((uint)ret < 0x29) {
              local_250 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_250 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            arg_ptr = (void *)*local_250;
            if ((undefined8 *)arg_ptr == (undefined8 *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *(undefined8 *)arg_ptr = 0;
            }
            break;
          case 9:
            if ((uint)ret < 0x29) {
              local_268 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_268 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_268;
            if ((ulong *)key_ptr == (ulong *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *(ulong *)key_ptr = (ulong)tlv_parse_data::data.content_size;
            }
            break;
          case 10:
            if ((uint)ret < 0x29) {
              local_280 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_280 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_280;
            if ((uint8_t *)key_ptr == (uint8_t *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *(uint8_t *)key_ptr = tlv_parse_data::data.signature.sig_type;
            }
            break;
          default:
            block_type = 0xffffffee;
            break;
          case 0xc:
            if ((uint)ret < 0x29) {
              local_298 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_298 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            pnStack_a0 = (ndn_hmac_key_t *)*local_298;
            break;
          case 0xd:
            if ((uint)ret < 0x29) {
              local_2b0 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_2b0 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_2b0;
            if ((uint64_t *)key_ptr == (uint64_t *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_data::data.signature.enable_Timestamp == '\0') {
              *(uint64_t *)key_ptr = 0;
            }
            else {
              *(uint64_t *)key_ptr = tlv_parse_data::data.signature.timestamp;
            }
            break;
          case 0xe:
            if ((uint)ret < 0x29) {
              local_2c8 = (int *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_2c8 = (int *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            local_a1 = *local_2c8 != 0;
          }
        }
        if (block_type == 0) {
          end = tlv_get_type_length(valptr,(long)namebuf_ptr - (long)valptr,&local_58,
                                    (uint32_t *)((long)&ptr + 4));
          if (local_58 == 7) {
            if (finalblockid_ptr != (uint8_t **)0x0) {
              *finalblockid_ptr = valptr;
            }
            valptr = end + ptr._4_4_;
            if ((tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') &&
               (content_ptr != (uint8_t **)0x0)) {
              end = tlv_get_type_length(valptr,(long)namebuf_ptr - (long)valptr,&local_58,
                                        (uint32_t *)((long)&ptr + 4));
              if (local_58 != 0x14) {
                return -0x11;
              }
              valptr = end + ptr._4_4_;
              while (end < valptr) {
                puVar2 = tlv_get_type_length(end,(long)namebuf_ptr - (long)end,&local_58,
                                             (uint32_t *)((long)&ptr + 4));
                if (local_58 == 0x1a) {
                  *content_ptr = puVar2;
                }
                end = puVar2 + ptr._4_4_;
              }
            }
            if ((arg_ptr != (void *)0x0) && (tlv_parse_data::data.content_size != 0)) {
              do {
                end = tlv_get_type_length(valptr,(long)namebuf_ptr - (long)valptr,&local_58,
                                          (uint32_t *)((long)&ptr + 4));
                valptr = end + ptr._4_4_;
                local_2c9 = local_58 != 0x15 && valptr < namebuf_ptr;
              } while (local_2c9);
              *(uint8_t **)arg_ptr = end;
            }
            if ((local_a1 & 1) != 0) {
              if (tlv_parse_data::data.signature.sig_type == '\0') {
                block_type = ndn_data_tlv_decode_digest_verify(&tlv_parse_data::data,buf,block_size)
                ;
              }
              else if (tlv_parse_data::data.signature.sig_type == '\x03') {
                if (pnStack_a0 == (ndn_hmac_key_t *)0x0) {
                  block_type = 0xfffffff0;
                }
                else {
                  block_type = ndn_data_tlv_decode_ecdsa_verify
                                         (&tlv_parse_data::data,buf,block_size,
                                          (ndn_ecc_pub_t *)pnStack_a0);
                }
              }
              else if (tlv_parse_data::data.signature.sig_type == '\x04') {
                if (pnStack_a0 == (ndn_hmac_key_t *)0x0) {
                  block_type = 0xfffffff0;
                }
                else {
                  block_type = ndn_data_tlv_decode_hmac_verify
                                         (&tlv_parse_data::data,buf,block_size,pnStack_a0);
                }
              }
              else {
                block_type = 0xffffffe6;
              }
            }
            buf_local._4_4_ = block_type;
          }
          else {
            buf_local._4_4_ = 0xffffffef;
          }
        }
        else {
          buf_local._4_4_ = block_type;
        }
      }
    }
    else {
      buf_local._4_4_ = 0xfffffff3;
    }
  }
  else {
    buf_local._4_4_ = 0xfffffff4;
  }
  return buf_local._4_4_;
}

Assistant:

int
tlv_parse_data(uint8_t* buf, size_t buflen, int argc, ...)
{
  static ndn_data_t data;
  va_list vl;
  int i, ret = NDN_SUCCESS;
  enum TLV_DATAARG_TYPE argtype;
  uint32_t block_type, block_len;
  uint8_t *ptr, *valptr, *end = buf + buflen;
  uint8_t **namebuf_ptr = NULL;
  uint8_t **finalblockid_ptr = NULL;
  uint8_t **content_ptr = NULL;
  void *arg_ptr = NULL;
  void *key_ptr = NULL;
  bool verify_sig = false;

  // Check type and length
  ptr = tlv_get_type_length(buf, buflen, &block_type, &block_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (block_type != TLV_Data) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (ptr + block_len != end) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Decode data
  ret = ndn_data_tlv_decode_no_verify(&data, buf, buflen, NULL, NULL);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Parse args
  va_start(vl, argc);
  for(i = 0; i < argc && ret == NDN_SUCCESS; i ++) {
    argtype = va_arg(vl, int);
    switch(argtype) {
      case TLV_DATAARG_NAME_PTR:
        arg_ptr = va_arg(vl, ndn_name_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(ndn_name_t*)arg_ptr = data.name;
        break;

      case TLV_DATAARG_NAME_BUF:
        namebuf_ptr = va_arg(vl, uint8_t**);
        if (namebuf_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *namebuf_ptr = NULL;
        break;

      case TLV_DATAARG_NAME_SEGNO_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.name.components_size > 0) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.name.components[data.name.components_size - 1]);
        }
        else {
          ret = NDN_UNSUPPORTED_FORMAT;
        }
        break;

      case TLV_DATAARG_CONTENTTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_ContentType) {
          *(uint8_t*)arg_ptr = data.metainfo.content_type;
        }
        else {
          *(uint8_t*)arg_ptr = 0xFF;
        }
        break;

      case TLV_DATAARG_FRESHNESSPERIOD_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FreshnessPeriod) {
          *(uint64_t*)arg_ptr = data.metainfo.freshness_period;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_PTR:
        arg_ptr = va_arg(vl, name_component_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(name_component_t*)arg_ptr = data.metainfo.final_block_id;
        }
        else {
          ((name_component_t*)arg_ptr)->size = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_BUF:
        finalblockid_ptr = va_arg(vl, uint8_t**);
        if (finalblockid_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *finalblockid_ptr = NULL;
        break;

      case TLV_DATAARG_FINALBLOCKID_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.metainfo.final_block_id);
        }
        else {
          *(uint64_t*)arg_ptr = (uint64_t)-1;
        }
        break;

      case TLV_DATAARG_CONTENT_BUF:
        content_ptr = va_arg(vl, uint8_t**);
        if (content_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *content_ptr = NULL;
        break;

      case TLV_DATAARG_CONTENT_SIZE:
        arg_ptr = va_arg(vl, size_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(size_t*)arg_ptr = (size_t)data.content_size;
        break;

      case TLV_DATAARG_SIGTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(uint8_t*)arg_ptr = data.signature.sig_type;
        break;

      case TLV_DATAARG_SIGKEY_PTR:
        key_ptr = va_arg(vl, void*);
        break;

      case TLV_DATAARG_SIGTIME_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else if (data.signature.enable_Timestamp) {
          *(uint64_t*)arg_ptr = data.signature.timestamp;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_VERIFY:
        verify_sig = va_arg(vl, uint32_t);
        break;

      default:
        ret = NDN_INVALID_ARG;
        break;
    }
  }
  va_end(vl);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Decode Name (No need to check for NULL since decoding succeeded)
  valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
  if (block_type != TLV_Name) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  if (namebuf_ptr != NULL) {
    *namebuf_ptr = ptr;
  }
  ptr = valptr + block_len;

  // Metainfo if applicable
  if (data.metainfo.enable_FinalBlockId && finalblockid_ptr != NULL) {
    valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
    if (block_type != TLV_MetaInfo) {
      return NDN_UNSUPPORTED_FORMAT;
    }
    ptr = valptr + block_len;

    while(valptr < ptr) {
      valptr = tlv_get_type_length(valptr, end - valptr, &block_type, &block_len);
      if (block_type == TLV_FinalBlockId) {
        *finalblockid_ptr = valptr;
      }
      valptr += block_len;
    }
  }

  // Content if applicable
  if (content_ptr && data.content_size > 0) {
    do{
      valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
      ptr = valptr + block_len;
    }while(block_type != TLV_Content && ptr < end);
    *content_ptr = valptr;
  }

  // Verify if required
  if (verify_sig) {
    switch(data.signature.sig_type) {
      case NDN_SIG_TYPE_DIGEST_SHA256:
        ret = ndn_data_tlv_decode_digest_verify(&data, buf, buflen);
        break;

      case NDN_SIG_TYPE_ECDSA_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_ecdsa_verify(&data, buf, buflen, (ndn_ecc_pub_t*)key_ptr);
        }
        break;

      case NDN_SIG_TYPE_HMAC_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_hmac_verify(&data, buf, buflen, (ndn_hmac_key_t*)key_ptr);
        }
        break;

      default:
        ret = NDN_SEC_UNSUPPORT_SIGN_TYPE;
        break;
    }
  }

  return ret;
}